

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DeadInsertElimPass::MarkInsertChain
          (DeadInsertElimPass *this,Instruction *insertChain,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *pExtIndices,uint32_t extOffset,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited_phis)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  size_type sVar7;
  size_type sVar8;
  iterator iVar9;
  reference puVar10;
  value_type *__x;
  value_type *__x_00;
  value_type *__x_01;
  value_type *__x_02;
  Instruction *pi;
  iterator id_iter;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_240;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  new_end;
  uint32_t local_228;
  uint local_224;
  undefined1 local_220 [4];
  uint32_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  undefined1 local_1f4 [16];
  uint32_t compId;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  obj_visited_phis_3;
  undefined1 local_1a8 [4];
  uint32_t objId_3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  obj_visited_phis_2;
  uint32_t objId_2;
  uint32_t numInsertIndices;
  undefined1 local_154 [12];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  obj_visited_phis_1;
  uint32_t objId_1;
  undefined1 local_fc [12];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  obj_visited_phis;
  uint32_t objId;
  undefined1 local_a4 [12];
  Instruction *insInst;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  sub_visited_phis;
  undefined1 local_58 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extIndices;
  uint32_t cnum;
  Instruction *typeInst;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *visited_phis_local;
  uint32_t extOffset_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pExtIndices_local;
  Instruction *insertChain_local;
  DeadInsertElimPass *this_local;
  
  pDVar5 = Pass::get_def_use_mgr((Pass *)this);
  uVar3 = opt::Instruction::type_id(insertChain);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
  OVar4 = opt::Instruction::opcode(pIVar6);
  if ((OVar4 != OpTypeArray) &&
     ((OVar4 = opt::Instruction::opcode(insertChain), OVar4 == OpCompositeInsert ||
      (OVar4 = opt::Instruction::opcode(insertChain), OVar4 == OpPhi)))) {
    local_a4._4_8_ = insertChain;
    if (pExtIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      extIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = NumComponents(this,pIVar6);
      if (extIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        for (sub_visited_phis._M_h._M_single_bucket._4_4_ = 0;
            sub_visited_phis._M_h._M_single_bucket._4_4_ <
            extIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
            sub_visited_phis._M_h._M_single_bucket._4_4_ =
                 sub_visited_phis._M_h._M_single_bucket._4_4_ + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                     (value_type_conflict *)((long)&sub_visited_phis._M_h._M_single_bucket + 4));
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&insInst);
          MarkInsertChain(this,insertChain,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&insInst);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&insInst);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        return;
      }
      extIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    while (OVar4 = opt::Instruction::opcode((Instruction *)local_a4._4_8_),
          OVar4 == OpCompositeInsert) {
      if (pExtIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        local_a4._0_4_ = opt::Instruction::result_id((Instruction *)local_a4._4_8_);
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 &this->liveInserts_,
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_a4,__x);
        obj_visited_phis._M_h._M_single_bucket._4_4_ =
             opt::Instruction::GetSingleWordInOperand((Instruction *)local_a4._4_8_,0);
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)(local_fc + 4));
        pDVar5 = Pass::get_def_use_mgr((Pass *)this);
        pIVar6 = analysis::DefUseManager::GetDef
                           (pDVar5,obj_visited_phis._M_h._M_single_bucket._4_4_);
        MarkInsertChain(this,pIVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,0,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)(local_fc + 4));
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)(local_fc + 4));
      }
      else {
        bVar2 = ExtInsMatch(pExtIndices,(Instruction *)local_a4._4_8_,extOffset);
        if (bVar2) {
          local_fc._0_4_ = opt::Instruction::result_id((Instruction *)local_a4._4_8_);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                   &this->liveInserts_,
                   (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_fc,__x_00);
          obj_visited_phis_1._M_h._M_single_bucket._4_4_ =
               opt::Instruction::GetSingleWordInOperand((Instruction *)local_a4._4_8_,0);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(local_154 + 4));
          pDVar5 = Pass::get_def_use_mgr((Pass *)this);
          pIVar6 = analysis::DefUseManager::GetDef
                             (pDVar5,obj_visited_phis_1._M_h._M_single_bucket._4_4_);
          MarkInsertChain(this,pIVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,0,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(local_154 + 4));
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)(local_154 + 4));
          break;
        }
        bVar2 = ExtInsConflict(pExtIndices,(Instruction *)local_a4._4_8_,extOffset);
        if (bVar2) {
          local_154._0_4_ = opt::Instruction::result_id((Instruction *)local_a4._4_8_);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                   &this->liveInserts_,
                   (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_154,__x_01);
          uVar3 = opt::Instruction::NumInOperands((Instruction *)local_a4._4_8_);
          obj_visited_phis_2._M_h._M_single_bucket._4_4_ = uVar3 - 2;
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pExtIndices);
          if ((ulong)obj_visited_phis_2._M_h._M_single_bucket._4_4_ < sVar7 - extOffset) {
            obj_visited_phis_2._M_h._M_single_bucket._0_4_ =
                 opt::Instruction::GetSingleWordInOperand((Instruction *)local_a4._4_8_,0);
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_1a8);
            pDVar5 = Pass::get_def_use_mgr((Pass *)this);
            pIVar6 = analysis::DefUseManager::GetDef
                               (pDVar5,(uint32_t)obj_visited_phis_2._M_h._M_single_bucket);
            MarkInsertChain(this,pIVar6,pExtIndices,
                            extOffset + obj_visited_phis_2._M_h._M_single_bucket._4_4_,
                            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_1a8);
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_1a8);
            break;
          }
          obj_visited_phis_3._M_h._M_single_bucket._4_4_ =
               opt::Instruction::GetSingleWordInOperand((Instruction *)local_a4._4_8_,0);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(local_1f4 + 0xc));
          pDVar5 = Pass::get_def_use_mgr((Pass *)this);
          pIVar6 = analysis::DefUseManager::GetDef
                             (pDVar5,obj_visited_phis_3._M_h._M_single_bucket._4_4_);
          MarkInsertChain(this,pIVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,0,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(local_1f4 + 0xc));
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)(local_1f4 + 0xc));
        }
      }
      local_1f4._8_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)local_a4._4_8_,1);
      pDVar5 = Pass::get_def_use_mgr((Pass *)this);
      local_a4._4_8_ = analysis::DefUseManager::GetDef(pDVar5,local_1f4._8_4_);
    }
    OVar4 = opt::Instruction::opcode((Instruction *)local_a4._4_8_);
    if (OVar4 == OpPhi) {
      local_1f4._4_4_ = opt::Instruction::result_id((Instruction *)local_a4._4_8_);
      sVar8 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(visited_phis,(key_type *)(local_1f4 + 4));
      if (sVar8 == 0) {
        local_1f4._0_4_ = opt::Instruction::result_id((Instruction *)local_a4._4_8_);
        ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool>
                                *)visited_phis,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_1f4,__x_02);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
        for (local_224 = 0; uVar1 = local_224,
            uVar3 = opt::Instruction::NumInOperands((Instruction *)local_a4._4_8_), uVar1 < uVar3;
            local_224 = local_224 + 2) {
          local_228 = opt::Instruction::GetSingleWordInOperand
                                ((Instruction *)local_a4._4_8_,local_224);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220,&local_228);
        }
        iVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
        new_end._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar9._M_current,new_end);
        iVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
        id_iter = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
        local_240 = std::
                    unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                              (iVar9._M_current,id_iter._M_current);
        pi = (Instruction *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)&pi,&local_240), bVar2) {
          pDVar5 = Pass::get_def_use_mgr((Pass *)this);
          puVar10 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&pi);
          pIVar6 = analysis::DefUseManager::GetDef(pDVar5,*puVar10);
          MarkInsertChain(this,pIVar6,pExtIndices,extOffset,visited_phis);
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&pi);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_220);
      }
    }
  }
  return;
}

Assistant:

void DeadInsertElimPass::MarkInsertChain(
    Instruction* insertChain, std::vector<uint32_t>* pExtIndices,
    uint32_t extOffset, std::unordered_set<uint32_t>* visited_phis) {
  // Not currently optimizing array inserts.
  Instruction* typeInst = get_def_use_mgr()->GetDef(insertChain->type_id());
  if (typeInst->opcode() == spv::Op::OpTypeArray) return;
  // Insert chains are only composed of inserts and phis
  if (insertChain->opcode() != spv::Op::OpCompositeInsert &&
      insertChain->opcode() != spv::Op::OpPhi)
    return;
  // If extract indices are empty, mark all subcomponents if type
  // is constant length.
  if (pExtIndices == nullptr) {
    uint32_t cnum = NumComponents(typeInst);
    if (cnum > 0) {
      std::vector<uint32_t> extIndices;
      for (uint32_t i = 0; i < cnum; i++) {
        extIndices.clear();
        extIndices.push_back(i);
        std::unordered_set<uint32_t> sub_visited_phis;
        MarkInsertChain(insertChain, &extIndices, 0, &sub_visited_phis);
      }
      return;
    }
  }
  Instruction* insInst = insertChain;
  while (insInst->opcode() == spv::Op::OpCompositeInsert) {
    // If no extract indices, mark insert and inserted object (which might
    // also be an insert chain) and continue up the chain though the input
    // composite.
    //
    // Note: We mark inserted objects in this function (rather than in
    // EliminateDeadInsertsOnePass) because in some cases, we can do it
    // more accurately here.
    if (pExtIndices == nullptr) {
      liveInserts_.insert(insInst->result_id());
      uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
      std::unordered_set<uint32_t> obj_visited_phis;
      MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                      &obj_visited_phis);
    // If extract indices match insert, we are done. Mark insert and
    // inserted object.
    } else if (ExtInsMatch(*pExtIndices, insInst, extOffset)) {
      liveInserts_.insert(insInst->result_id());
      uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
      std::unordered_set<uint32_t> obj_visited_phis;
      MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                      &obj_visited_phis);
      break;
    // If non-matching intersection, mark insert
    } else if (ExtInsConflict(*pExtIndices, insInst, extOffset)) {
      liveInserts_.insert(insInst->result_id());
      // If more extract indices than insert, we are done. Use remaining
      // extract indices to mark inserted object.
      uint32_t numInsertIndices = insInst->NumInOperands() - 2;
      if (pExtIndices->size() - extOffset > numInsertIndices) {
        uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
        std::unordered_set<uint32_t> obj_visited_phis;
        MarkInsertChain(get_def_use_mgr()->GetDef(objId), pExtIndices,
                        extOffset + numInsertIndices, &obj_visited_phis);
        break;
      // If fewer extract indices than insert, also mark inserted object and
      // continue up chain.
      } else {
        uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
        std::unordered_set<uint32_t> obj_visited_phis;
        MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                        &obj_visited_phis);
      }
    }
    // Get next insert in chain
    const uint32_t compId =
        insInst->GetSingleWordInOperand(kInsertCompositeIdInIdx);
    insInst = get_def_use_mgr()->GetDef(compId);
  }
  // If insert chain ended with phi, do recursive call on each operand
  if (insInst->opcode() != spv::Op::OpPhi) return;
  // Mark phi visited to prevent potential infinite loop. If phi is already
  // visited, return to avoid infinite loop.
  if (visited_phis->count(insInst->result_id()) != 0) return;
  visited_phis->insert(insInst->result_id());

  // Phis may have duplicate inputs values for different edges, prune incoming
  // ids lists before recursing.
  std::vector<uint32_t> ids;
  for (uint32_t i = 0; i < insInst->NumInOperands(); i += 2) {
    ids.push_back(insInst->GetSingleWordInOperand(i));
  }
  std::sort(ids.begin(), ids.end());
  auto new_end = std::unique(ids.begin(), ids.end());
  for (auto id_iter = ids.begin(); id_iter != new_end; ++id_iter) {
    Instruction* pi = get_def_use_mgr()->GetDef(*id_iter);
    MarkInsertChain(pi, pExtIndices, extOffset, visited_phis);
  }
}